

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double incirclefast(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double clift;
  double blift;
  double alift;
  double cadet;
  double bcdet;
  double abdet;
  double cdy;
  double cdx;
  double bdy;
  double bdx;
  double ady;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = *pa - *pd;
  dVar2 = pa[1] - pd[1];
  dVar3 = *pb - *pd;
  dVar4 = pb[1] - pd[1];
  dVar5 = *pc - *pd;
  dVar6 = pc[1] - pd[1];
  return (dVar5 * dVar5 + dVar6 * dVar6) * (dVar1 * dVar4 + -(dVar3 * dVar2)) +
         (dVar1 * dVar1 + dVar2 * dVar2) * (dVar3 * dVar6 + -(dVar5 * dVar4)) +
         (dVar3 * dVar3 + dVar4 * dVar4) * (dVar5 * dVar2 + -(dVar1 * dVar6));
}

Assistant:

REAL incirclefast(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, ady, bdx, bdy, cdx, cdy;
  REAL abdet, bcdet, cadet;
  REAL alift, blift, clift;

  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];

  abdet = adx * bdy - bdx * ady;
  bcdet = bdx * cdy - cdx * bdy;
  cadet = cdx * ady - adx * cdy;
  alift = adx * adx + ady * ady;
  blift = bdx * bdx + bdy * bdy;
  clift = cdx * cdx + cdy * cdy;

  return alift * bcdet + blift * cadet + clift * abdet;
}